

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_arshift(lua_State *L)

{
  lua_Unsigned r_00;
  int iVar1;
  lua_Integer lVar2;
  undefined4 local_1c;
  int i;
  b_uint r;
  lua_State *L_local;
  
  r_00 = luaL_checkunsigned(L,1);
  lVar2 = luaL_checkinteger(L,2);
  iVar1 = (int)lVar2;
  if ((iVar1 < 0) || ((r_00 & 0x80000000) == 0)) {
    L_local._4_4_ = b_shift(L,r_00,-iVar1);
  }
  else {
    if (iVar1 < 0x20) {
      local_1c = r_00 >> ((byte)lVar2 & 0x1f) | 0xffffffffU >> ((byte)lVar2 & 0x1f) ^ 0xffffffff;
    }
    else {
      local_1c = 0xffffffff;
    }
    lua_pushunsigned(L,local_1c);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int b_arshift (lua_State *L) {
  b_uint r = luaL_checkunsigned(L, 1);
  int i = luaL_checkint(L, 2);
  if (i < 0 || !(r & ((b_uint)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(~(b_uint)0 >> i));  /* add signal bit */
    lua_pushunsigned(L, r);
    return 1;
  }
}